

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_STOCH_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement
                )

{
  TA_RetCode TVar1;
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  double *unaff_R12;
  double *unaff_R14;
  double *unaff_R15;
  int unaff_retaddr;
  int in_stack_00000010;
  TA_MAType in_stack_00000018;
  int in_stack_00000020;
  TA_MAType in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  
  TVar1 = TA_STOCH(unaff_retaddr,(int)((ulong)unaff_RBP >> 0x20),unaff_R15,unaff_R14,unaff_R12,
                   (int)((ulong)unaff_RBX >> 0x20),in_stack_00000010,in_stack_00000018,
                   in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                   (double *)outNBElement,(double *)outBegIdx);
  return TVar1;
}

Assistant:

TA_RetCode TA_STOCH_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_STOCH(
/* Generated */               startIdx,
/* Generated */               endIdx,
/* Generated */               params->in[0].data.inPrice.high, /* inHigh */
/* Generated */               params->in[0].data.inPrice.low, /* inLow */
/* Generated */               params->in[0].data.inPrice.close, /* inClose */
/* Generated */               params->optIn[0].data.optInInteger, /* optInFastK_Period*/
/* Generated */               params->optIn[1].data.optInInteger, /* optInSlowK_Period*/
/* Generated */               (TA_MAType)params->optIn[2].data.optInInteger, /* optInSlowK_MAType*/
/* Generated */               params->optIn[3].data.optInInteger, /* optInSlowD_Period*/
/* Generated */               (TA_MAType)params->optIn[4].data.optInInteger, /* optInSlowD_MAType*/
/* Generated */               outBegIdx, 
/* Generated */               outNBElement, 
/* Generated */               params->out[0].data.outReal, /*  outSlowK */
/* Generated */               params->out[1].data.outReal /*  outSlowD */ );
/* Generated */ }